

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_paged_audio_buffer_get_cursor_in_pcm_frames
                    (ma_paged_audio_buffer *pPagedAudioBuffer,ma_uint64 *pCursor)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pCursor != (ma_uint64 *)0x0) &&
     (*pCursor = 0, pPagedAudioBuffer != (ma_paged_audio_buffer *)0x0)) {
    *pCursor = pPagedAudioBuffer->absoluteCursor;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_get_cursor_in_pcm_frames(ma_paged_audio_buffer* pPagedAudioBuffer, ma_uint64* pCursor)
{
    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;   /* Safety. */

    if (pPagedAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = pPagedAudioBuffer->absoluteCursor;

    return MA_SUCCESS;
}